

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::execution_is_branchless(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRBlock *local_30;
  SPIRBlock *start;
  SPIRBlock *to_local;
  SPIRBlock *from_local;
  Compiler *this_local;
  
  local_30 = from;
  while( true ) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_30->super_IVariant).self);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(to->super_IVariant).self);
    if (uVar1 == uVar2) {
      return true;
    }
    if ((*(int *)&(local_30->super_IVariant).field_0xc != 1) || (local_30->merge != MergeNone))
    break;
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30->next_block);
    local_30 = get<spirv_cross::SPIRBlock>(this,uVar1);
  }
  return false;
}

Assistant:

bool Compiler::execution_is_branchless(const SPIRBlock &from, const SPIRBlock &to) const
{
	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (start->terminator == SPIRBlock::Direct && start->merge == SPIRBlock::MergeNone)
			start = &get<SPIRBlock>(start->next_block);
		else
			return false;
	}
}